

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O3

xmlEntityPtr xmlSAX2GetParameterEntity(void *ctx,xmlChar *name)

{
  xmlEntityPtr pxVar1;
  xmlParserCtxtPtr ctxt;
  
  if (ctx != (void *)0x0) {
    pxVar1 = xmlGetParameterEntity(*(xmlDocPtr *)((long)ctx + 0x10),name);
    return pxVar1;
  }
  return (xmlEntityPtr)0x0;
}

Assistant:

xmlEntityPtr
xmlSAX2GetParameterEntity(void *ctx, const xmlChar *name)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlEntityPtr ret;

    if (ctx == NULL) return(NULL);
#ifdef DEBUG_SAX
    xmlGenericError(xmlGenericErrorContext,
	    "SAX.xmlSAX2GetParameterEntity(%s)\n", name);
#endif

    ret = xmlGetParameterEntity(ctxt->myDoc, name);
    return(ret);
}